

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall tetgenmesh::recoverboundary(tetgenmesh *this,clock_t *tv)

{
  memorypool *pmVar1;
  void **ppvVar2;
  point pdVar3;
  ulong uVar4;
  int iVar5;
  arraypool *misseglist;
  arraypool *this_00;
  unsigned_long uVar6;
  char *pcVar7;
  void *pvVar8;
  char *pcVar9;
  clock_t cVar10;
  arraypool *paVar11;
  arraypool *paVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  
  if (this->b->quiet == 0) {
    puts("Recovering boundaries...");
  }
  if (this->b->verbose != 0) {
    puts("  Recovering segments.");
  }
  this->checksubsegflag = 1;
  misseglist = (arraypool *)operator_new(0x30);
  misseglist->objectbytes = 0x10;
  misseglist->objectsperblock = 0x100;
  misseglist->log2objectsperblock = 8;
  misseglist->objectsperblockmark = 0xff;
  misseglist->toparraylen = 0;
  misseglist->toparray = (char **)0x0;
  misseglist->objects = 0;
  misseglist->totalmemory = 0;
  this_00 = (arraypool *)operator_new(0x30);
  this_00->objectbytes = 8;
  this_00->objectsperblock = 0x100;
  this_00->log2objectsperblock = 8;
  this_00->objectsperblockmark = 0xff;
  this_00->toparraylen = 0;
  this_00->toparray = (char **)0x0;
  this_00->objects = 0;
  this_00->totalmemory = 0;
  pmVar1 = this->subsegs;
  ppvVar2 = pmVar1->firstblock;
  pmVar1->pathblock = ppvVar2;
  pmVar1->pathitem =
       (void *)((long)ppvVar2 +
               (((long)pmVar1->alignbytes + 8U) -
               (ulong)(ppvVar2 + 1) % (ulong)(long)pmVar1->alignbytes));
  pmVar1->pathitemsleft = pmVar1->itemsperblock;
  lVar13 = this->subsegs->items;
  if (0 < lVar13) {
    lVar18 = 0;
    do {
      lVar18 = lVar18 + 1;
      uVar6 = randomnation(this,(uint)lVar18);
      paVar11 = this->subsegstack;
      pcVar7 = arraypool::getblock(paVar11,(int)paVar11->objects);
      lVar15 = (long)paVar11->objectbytes * ((long)paVar11->objectsperblock - 1U & paVar11->objects)
      ;
      paVar11->objects = paVar11->objects + 1;
      paVar11 = this->subsegstack;
      uVar14 = (uint)uVar6;
      pcVar9 = paVar11->toparray[(int)uVar14 >> ((byte)paVar11->log2objectsperblock & 0x1f)];
      lVar13 = (long)paVar11->objectbytes * (long)(int)(paVar11->objectsperblockmark & uVar14);
      *(undefined8 *)(pcVar7 + lVar15) = *(undefined8 *)(pcVar9 + lVar13);
      *(undefined4 *)(pcVar7 + lVar15 + 8) = *(undefined4 *)(pcVar9 + lVar13 + 8);
      pmVar1 = this->subsegs;
      do {
        pvVar8 = memorypool::traverse(pmVar1);
        if (pvVar8 == (void *)0x0) {
          pvVar8 = (void *)0x0;
          break;
        }
      } while (*(long *)((long)pvVar8 + 0x18) == 0);
      paVar11 = this->subsegstack;
      pcVar9 = paVar11->toparray[(int)uVar14 >> ((byte)paVar11->log2objectsperblock & 0x1f)];
      lVar13 = (long)paVar11->objectbytes * (long)(int)(uVar14 & paVar11->objectsperblockmark);
      *(void **)(pcVar9 + lVar13) = pvVar8;
      pcVar9 = pcVar9 + lVar13 + 8;
      pcVar9[0] = '\0';
      pcVar9[1] = '\0';
      pcVar9[2] = '\0';
      pcVar9[3] = '\0';
      lVar13 = this->subsegs->items;
    } while (lVar18 < lVar13);
  }
  if (this->b->fliplinklevel < 0) {
    this->autofliplinklevel = 1;
  }
  iVar5 = 0;
  while( true ) {
    recoversegments(this,misseglist,0,0);
    lVar18 = misseglist->objects;
    if ((lVar18 < 1) || (-1 < this->b->fliplinklevel)) break;
    if (lVar18 < lVar13) {
      iVar17 = iVar5 - (uint)(0 < iVar5);
      lVar13 = lVar18;
    }
    else {
      iVar17 = iVar5 + 1;
      if (1 < iVar5) {
        this->b->fliplinklevel = 100000;
      }
    }
    if (0 < misseglist->objects) {
      lVar18 = 0;
      do {
        paVar11 = this->subsegstack;
        pcVar7 = arraypool::getblock(paVar11,(int)paVar11->objects);
        lVar15 = (long)paVar11->objectbytes *
                 ((long)paVar11->objectsperblock - 1U & paVar11->objects);
        paVar11->objects = paVar11->objects + 1;
        pcVar9 = misseglist->toparray
                 [(uint)lVar18 >> ((byte)misseglist->log2objectsperblock & 0x1f)];
        lVar16 = (long)misseglist->objectbytes *
                 (long)(int)(misseglist->objectsperblockmark & (uint)lVar18);
        *(undefined8 *)(pcVar7 + lVar15) = *(undefined8 *)(pcVar9 + lVar16);
        *(undefined4 *)(pcVar7 + lVar15 + 8) = *(undefined4 *)(pcVar9 + lVar16 + 8);
        lVar18 = lVar18 + 1;
      } while (lVar18 < misseglist->objects);
    }
    misseglist->objects = 0;
    this->autofliplinklevel = this->autofliplinklevel + this->b->fliplinklevelinc;
    iVar5 = iVar17;
  }
  if (this->b->verbose != 0) {
    printf("  %ld (%ld) segments are recovered (missing).\n",this->subsegs->items - lVar18);
  }
  if (0 < misseglist->objects) {
    do {
      lVar13 = misseglist->objects;
      if (lVar13 < 1) break;
      if (0 < misseglist->objects) {
        lVar18 = 0;
        do {
          paVar11 = this->subsegstack;
          pcVar7 = arraypool::getblock(paVar11,(int)paVar11->objects);
          lVar15 = (long)paVar11->objectbytes *
                   ((long)paVar11->objectsperblock - 1U & paVar11->objects);
          paVar11->objects = paVar11->objects + 1;
          pcVar9 = misseglist->toparray
                   [(uint)lVar18 >> ((byte)misseglist->log2objectsperblock & 0x1f)];
          lVar16 = (long)misseglist->objectbytes *
                   (long)(int)(misseglist->objectsperblockmark & (uint)lVar18);
          *(undefined8 *)(pcVar7 + lVar15) = *(undefined8 *)(pcVar9 + lVar16);
          *(undefined4 *)(pcVar7 + lVar15 + 8) = *(undefined4 *)(pcVar9 + lVar16 + 8);
          lVar18 = lVar18 + 1;
        } while (lVar18 < misseglist->objects);
      }
      misseglist->objects = 0;
      recoversegments(this,misseglist,1,0);
    } while (misseglist->objects < lVar13);
    if (this->b->verbose != 0) {
      printf("  %ld (%ld) segments are recovered (missing).\n",
             this->subsegs->items - misseglist->objects);
    }
  }
  if (0 < misseglist->objects) {
    do {
      lVar13 = misseglist->objects;
      if (lVar13 < 1) break;
      if (0 < misseglist->objects) {
        lVar18 = 0;
        do {
          paVar11 = this->subsegstack;
          pcVar7 = arraypool::getblock(paVar11,(int)paVar11->objects);
          lVar15 = (long)paVar11->objectbytes *
                   ((long)paVar11->objectsperblock - 1U & paVar11->objects);
          paVar11->objects = paVar11->objects + 1;
          pcVar9 = misseglist->toparray
                   [(uint)lVar18 >> ((byte)misseglist->log2objectsperblock & 0x1f)];
          lVar16 = (long)misseglist->objectbytes *
                   (long)(int)(misseglist->objectsperblockmark & (uint)lVar18);
          *(undefined8 *)(pcVar7 + lVar15) = *(undefined8 *)(pcVar9 + lVar16);
          *(undefined4 *)(pcVar7 + lVar15 + 8) = *(undefined4 *)(pcVar9 + lVar16 + 8);
          lVar18 = lVar18 + 1;
        } while (lVar18 < misseglist->objects);
      }
      misseglist->objects = 0;
      recoversegments(this,misseglist,1,1);
    } while (misseglist->objects < lVar13);
    if (this->b->verbose != 0) {
      printf("  Added %ld Steiner points in volume.\n",this->st_volref_count);
    }
  }
  if (0 < misseglist->objects) {
    lVar13 = this->st_volref_count;
    if (0 < misseglist->objects) {
      lVar18 = 0;
      do {
        paVar11 = this->subsegstack;
        pcVar7 = arraypool::getblock(paVar11,(int)paVar11->objects);
        lVar15 = (long)paVar11->objectbytes *
                 ((long)paVar11->objectsperblock - 1U & paVar11->objects);
        paVar11->objects = paVar11->objects + 1;
        pcVar9 = misseglist->toparray
                 [(uint)lVar18 >> ((byte)misseglist->log2objectsperblock & 0x1f)];
        lVar16 = (long)misseglist->objectbytes *
                 (long)(int)(misseglist->objectsperblockmark & (uint)lVar18);
        *(undefined8 *)(pcVar7 + lVar15) = *(undefined8 *)(pcVar9 + lVar16);
        *(undefined4 *)(pcVar7 + lVar15 + 8) = *(undefined4 *)(pcVar9 + lVar16 + 8);
        lVar18 = lVar18 + 1;
      } while (lVar18 < misseglist->objects);
    }
    misseglist->objects = 0;
    recoversegments(this,misseglist,1,2);
    if ((this->b->verbose != 0) &&
       (printf("  Added %ld Steiner points in segments.\n",this->st_segref_count),
       lVar13 < this->st_volref_count)) {
      printf("  Added another %ld Steiner points in volume.\n");
    }
  }
  lVar13 = this->st_segref_count;
  if (0 < lVar13) {
    paVar11 = this->subvertstack;
    lVar18 = this->st_volref_count;
    if (0 < paVar11->objects) {
      lVar15 = 0;
      do {
        pdVar3 = *(point *)(paVar11->toparray
                            [(uint)lVar15 >> ((byte)paVar11->log2objectsperblock & 0x1f)] +
                           (long)paVar11->objectbytes *
                           (long)(int)(paVar11->objectsperblockmark & (uint)lVar15));
        iVar5 = removevertexbyflips(this,pdVar3);
        if (iVar5 == 0) {
          pcVar9 = arraypool::getblock(this_00,(int)this_00->objects);
          uVar4 = this_00->objects;
          this_00->objects = uVar4 + 1;
          *(point *)(pcVar9 + (long)this_00->objectbytes *
                              ((long)this_00->objectsperblock - 1U & uVar4)) = pdVar3;
        }
        lVar15 = lVar15 + 1;
        paVar11 = this->subvertstack;
      } while (lVar15 < paVar11->objects);
    }
    if ((this->b->verbose != 0) && (this->st_segref_count < lVar13)) {
      if (lVar18 < this->st_volref_count) {
        printf("  Suppressed %ld Steiner points in segments.\n");
      }
      lVar18 = (this->st_volref_count - lVar18) + this->st_segref_count;
      lVar15 = lVar13 - lVar18;
      if (lVar15 != 0 && lVar18 <= lVar13) {
        printf("  Removed %ld Steiner points in segments.\n",lVar15);
      }
    }
    this->subvertstack->objects = 0;
  }
  cVar10 = clock();
  *tv = cVar10;
  if (this->b->verbose != 0) {
    puts("  Recovering facets.");
  }
  this->checksubfaceflag = 1;
  paVar11 = (arraypool *)operator_new(0x30);
  paVar11->objectbytes = 0x10;
  paVar11->objectsperblock = 0x100;
  paVar11->log2objectsperblock = 8;
  paVar11->objectsperblockmark = 0xff;
  paVar11->toparraylen = 0;
  paVar11->toparray = (char **)0x0;
  paVar11->objects = 0;
  paVar11->totalmemory = 0;
  pmVar1 = this->subfaces;
  ppvVar2 = pmVar1->firstblock;
  pmVar1->pathblock = ppvVar2;
  pmVar1->pathitem =
       (void *)((long)ppvVar2 +
               (((long)pmVar1->alignbytes + 8U) -
               (ulong)(ppvVar2 + 1) % (ulong)(long)pmVar1->alignbytes));
  pmVar1->pathitemsleft = pmVar1->itemsperblock;
  lVar13 = this->subfaces->items;
  if (0 < lVar13) {
    lVar18 = 0;
    do {
      lVar18 = lVar18 + 1;
      uVar6 = randomnation(this,(uint)lVar18);
      paVar12 = this->subfacstack;
      pcVar7 = arraypool::getblock(paVar12,(int)paVar12->objects);
      lVar15 = (long)paVar12->objectbytes * ((long)paVar12->objectsperblock - 1U & paVar12->objects)
      ;
      paVar12->objects = paVar12->objects + 1;
      paVar12 = this->subfacstack;
      uVar14 = (uint)uVar6;
      pcVar9 = paVar12->toparray[(int)uVar14 >> ((byte)paVar12->log2objectsperblock & 0x1f)];
      lVar13 = (long)paVar12->objectbytes * (long)(int)(paVar12->objectsperblockmark & uVar14);
      *(undefined8 *)(pcVar7 + lVar15) = *(undefined8 *)(pcVar9 + lVar13);
      *(undefined4 *)(pcVar7 + lVar15 + 8) = *(undefined4 *)(pcVar9 + lVar13 + 8);
      pmVar1 = this->subfaces;
      do {
        pvVar8 = memorypool::traverse(pmVar1);
        if (pvVar8 == (void *)0x0) {
          pvVar8 = (void *)0x0;
          break;
        }
      } while (*(long *)((long)pvVar8 + 0x18) == 0);
      paVar12 = this->subfacstack;
      pcVar9 = paVar12->toparray[(int)uVar14 >> ((byte)paVar12->log2objectsperblock & 0x1f)];
      lVar13 = (long)paVar12->objectbytes * (long)(int)(uVar14 & paVar12->objectsperblockmark);
      *(void **)(pcVar9 + lVar13) = pvVar8;
      pcVar9 = pcVar9 + lVar13 + 8;
      pcVar9[0] = '\0';
      pcVar9[1] = '\0';
      pcVar9[2] = '\0';
      pcVar9[3] = '\0';
      lVar13 = this->subfaces->items;
    } while (lVar18 < lVar13);
  }
  this->b->fliplinklevel = -1;
  this->autofliplinklevel = 1;
  recoversubfaces(this,paVar11,0);
  lVar18 = paVar11->objects;
  iVar5 = 0;
  while ((0 < lVar18 && (this->b->fliplinklevel < 0))) {
    if (lVar18 < lVar13) {
      iVar17 = iVar5 - (uint)(0 < iVar5);
      lVar13 = lVar18;
    }
    else {
      iVar17 = iVar5 + 1;
      if (1 < iVar5) {
        this->b->fliplinklevel = 100000;
      }
    }
    if (0 < paVar11->objects) {
      lVar18 = 0;
      do {
        paVar12 = this->subfacstack;
        pcVar7 = arraypool::getblock(paVar12,(int)paVar12->objects);
        lVar15 = (long)paVar12->objectbytes *
                 ((long)paVar12->objectsperblock - 1U & paVar12->objects);
        paVar12->objects = paVar12->objects + 1;
        pcVar9 = paVar11->toparray[(uint)lVar18 >> ((byte)paVar11->log2objectsperblock & 0x1f)];
        lVar16 = (long)paVar11->objectbytes *
                 (long)(int)(paVar11->objectsperblockmark & (uint)lVar18);
        *(undefined8 *)(pcVar7 + lVar15) = *(undefined8 *)(pcVar9 + lVar16);
        *(undefined4 *)(pcVar7 + lVar15 + 8) = *(undefined4 *)(pcVar9 + lVar16 + 8);
        lVar18 = lVar18 + 1;
      } while (lVar18 < paVar11->objects);
    }
    paVar11->objects = 0;
    this->autofliplinklevel = this->autofliplinklevel + this->b->fliplinklevelinc;
    recoversubfaces(this,paVar11,0);
    lVar18 = paVar11->objects;
    iVar5 = iVar17;
  }
  if (this->b->verbose != 0) {
    printf("  %ld (%ld) subfaces are recovered (missing).\n");
  }
  if (0 < paVar11->objects) {
    if (0 < paVar11->objects) {
      lVar13 = 0;
      do {
        paVar12 = this->subfacstack;
        pcVar7 = arraypool::getblock(paVar12,(int)paVar12->objects);
        lVar18 = (long)paVar12->objectbytes *
                 ((long)paVar12->objectsperblock - 1U & paVar12->objects);
        paVar12->objects = paVar12->objects + 1;
        pcVar9 = paVar11->toparray[(uint)lVar13 >> ((byte)paVar11->log2objectsperblock & 0x1f)];
        lVar15 = (long)paVar11->objectbytes *
                 (long)(int)(paVar11->objectsperblockmark & (uint)lVar13);
        *(undefined8 *)(pcVar7 + lVar18) = *(undefined8 *)(pcVar9 + lVar15);
        *(undefined4 *)(pcVar7 + lVar18 + 8) = *(undefined4 *)(pcVar9 + lVar15 + 8);
        lVar13 = lVar13 + 1;
      } while (lVar13 < paVar11->objects);
    }
    paVar11->objects = 0;
    recoversubfaces(this,(arraypool *)0x0,1);
    if (this->b->verbose != 0) {
      printf("  Added %ld Steiner points in facets.\n",this->st_facref_count);
    }
  }
  lVar13 = this->st_facref_count;
  if (0 < lVar13) {
    paVar12 = this->subvertstack;
    if (0 < paVar12->objects) {
      lVar18 = 0;
      do {
        pdVar3 = *(point *)(paVar12->toparray
                            [(uint)lVar18 >> ((byte)paVar12->log2objectsperblock & 0x1f)] +
                           (long)paVar12->objectbytes *
                           (long)(int)(paVar12->objectsperblockmark & (uint)lVar18));
        iVar5 = removevertexbyflips(this,pdVar3);
        if (iVar5 == 0) {
          pcVar9 = arraypool::getblock(this_00,(int)this_00->objects);
          uVar4 = this_00->objects;
          this_00->objects = uVar4 + 1;
          *(point *)(pcVar9 + (long)this_00->objectbytes *
                              ((long)this_00->objectsperblock - 1U & uVar4)) = pdVar3;
        }
        lVar18 = lVar18 + 1;
        paVar12 = this->subvertstack;
      } while (lVar18 < paVar12->objects);
    }
    if ((this->b->verbose != 0) && (this->st_facref_count < lVar13)) {
      printf("  Removed %ld Steiner points in facets.\n");
    }
    this->subvertstack->objects = 0;
  }
  if ((0 < this_00->objects) && (this->b->verbose != 0)) {
    printf("  %ld Steiner points remained in boundary.\n");
  }
  this->totalworkmemory =
       this->totalworkmemory + paVar11->totalmemory + misseglist->totalmemory + this_00->totalmemory
  ;
  arraypool::~arraypool(this_00);
  operator_delete(this_00,0x30);
  arraypool::~arraypool(misseglist);
  operator_delete(misseglist,0x30);
  arraypool::~arraypool(paVar11);
  operator_delete(paVar11,0x30);
  return;
}

Assistant:

void tetgenmesh::recoverboundary(clock_t& tv)
{
  arraypool *misseglist, *misshlist;
  arraypool *bdrysteinerptlist;
  face searchsh, *parysh;
  face searchseg, *paryseg;
  point rempt, *parypt;
  long ms; // The number of missing segments/subfaces.
  int nit; // The number of iterations.
  int s, i;

  // Counters.
  long bak_segref_count, bak_facref_count, bak_volref_count;

  if (!b->quiet) {
    printf("Recovering boundaries...\n");
  }


  if (b->verbose) {
    printf("  Recovering segments.\n");
  }

  // Segments will be introduced.
  checksubsegflag = 1;

  misseglist = new arraypool(sizeof(face), 8);
  bdrysteinerptlist = new arraypool(sizeof(point), 8);

  // In random order.
  subsegs->traversalinit();
  for (i = 0; i < subsegs->items; i++) {
    s = randomnation(i + 1);
    // Move the s-th seg to the i-th.
    subsegstack->newindex((void **) &paryseg);
    *paryseg = * (face *) fastlookup(subsegstack, s);
    // Put i-th seg to be the s-th.
    searchseg.sh = shellfacetraverse(subsegs);
    paryseg = (face *) fastlookup(subsegstack, s);
    *paryseg = searchseg;
  }

  // The init number of missing segments.
  ms = subsegs->items;
  nit = 0; 
  if (b->fliplinklevel < 0) {
    autofliplinklevel = 1; // Init value.
  }

  // First, trying to recover segments by only doing flips.
  while (1) {
    recoversegments(misseglist, 0, 0);

    if (misseglist->objects > 0) {
      if (b->fliplinklevel >= 0) {
        break;
      } else {
        if (misseglist->objects >= ms) {
          nit++;
          if (nit >= 3) {
            //break;
            // Do the last round with unbounded flip link level.
            b->fliplinklevel = 100000;
          }
        } else {
          ms = misseglist->objects;
          if (nit > 0) {
            nit--;
          }
        }
        for (i = 0; i < misseglist->objects; i++) {
          subsegstack->newindex((void **) &paryseg);
          *paryseg = * (face *) fastlookup(misseglist, i);
        }
        misseglist->restart();
        autofliplinklevel+=b->fliplinklevelinc;
      }
    } else {
      // All segments are recovered.
      break;
    }
  } // while (1)

  if (b->verbose) {
    printf("  %ld (%ld) segments are recovered (missing).\n", 
           subsegs->items - misseglist->objects, misseglist->objects);
  }

  if (misseglist->objects > 0) {
    // Second, trying to recover segments by doing more flips (fullsearch).
    while (misseglist->objects > 0) {
      ms = misseglist->objects;
      for (i = 0; i < misseglist->objects; i++) {
        subsegstack->newindex((void **) &paryseg);
        *paryseg = * (face *) fastlookup(misseglist, i);
      }
      misseglist->restart();

      recoversegments(misseglist, 1, 0);

      if (misseglist->objects < ms) {
        // The number of missing segments is reduced.
        continue;
      } else {
        break;
      }
    }
    if (b->verbose) {
      printf("  %ld (%ld) segments are recovered (missing).\n", 
             subsegs->items - misseglist->objects, misseglist->objects);
    }
  }

  if (misseglist->objects > 0) {
    // Third, trying to recover segments by doing more flips (fullsearch)
    //   and adding Steiner points in the volume.
    while (misseglist->objects > 0) {
      ms = misseglist->objects;
      for (i = 0; i < misseglist->objects; i++) {
        subsegstack->newindex((void **) &paryseg);
        *paryseg = * (face *) fastlookup(misseglist, i);
      }
      misseglist->restart();

      recoversegments(misseglist, 1, 1);

      if (misseglist->objects < ms) {
        // The number of missing segments is reduced.
        continue;
      } else {
        break;
      }
    }
    if (b->verbose) {
      printf("  Added %ld Steiner points in volume.\n", st_volref_count);
    }
  }

  if (misseglist->objects > 0) {
    // Last, trying to recover segments by doing more flips (fullsearch),
    //   and adding Steiner points in the volume, and splitting segments.
    long bak_inpoly_count = st_volref_count; //st_inpoly_count;
    for (i = 0; i < misseglist->objects; i++) {
      subsegstack->newindex((void **) &paryseg);
      *paryseg = * (face *) fastlookup(misseglist, i);
    }
    misseglist->restart();

    recoversegments(misseglist, 1, 2);

    if (b->verbose) {
      printf("  Added %ld Steiner points in segments.\n", st_segref_count);
      if (st_volref_count > bak_inpoly_count) {
        printf("  Added another %ld Steiner points in volume.\n", 
               st_volref_count - bak_inpoly_count);
      }
    }
  }


  if (st_segref_count > 0) {
    // Try to remove the Steiner points added in segments.
    bak_segref_count = st_segref_count;
    bak_volref_count = st_volref_count;
    for (i = 0; i < subvertstack->objects; i++) {
      // Get the Steiner point.
      parypt = (point *) fastlookup(subvertstack, i);
      rempt = *parypt;
      if (!removevertexbyflips(rempt)) {
        // Save it in list.
        bdrysteinerptlist->newindex((void **) &parypt);
        *parypt = rempt;
      }
    }
    if (b->verbose) {
      if (st_segref_count < bak_segref_count) {
        if (bak_volref_count < st_volref_count) {
          printf("  Suppressed %ld Steiner points in segments.\n", 
                 st_volref_count - bak_volref_count);
        }
        if ((st_segref_count + (st_volref_count - bak_volref_count)) <
            bak_segref_count) {
          printf("  Removed %ld Steiner points in segments.\n", 
                 bak_segref_count - 
                   (st_segref_count + (st_volref_count - bak_volref_count)));
        }
      }
    }
    subvertstack->restart();
  }


  tv = clock();

  if (b->verbose) {
    printf("  Recovering facets.\n");
  }

  // Subfaces will be introduced.
  checksubfaceflag = 1;

  misshlist = new arraypool(sizeof(face), 8);

  // Randomly order the subfaces.
  subfaces->traversalinit();
  for (i = 0; i < subfaces->items; i++) {
    s = randomnation(i + 1);
    // Move the s-th subface to the i-th.
    subfacstack->newindex((void **) &parysh);
    *parysh = * (face *) fastlookup(subfacstack, s);
    // Put i-th subface to be the s-th.
    searchsh.sh = shellfacetraverse(subfaces);
    parysh = (face *) fastlookup(subfacstack, s);
    *parysh = searchsh;
  }

  ms = subfaces->items;
  nit = 0; 
  b->fliplinklevel = -1; // Init.
  if (b->fliplinklevel < 0) {
    autofliplinklevel = 1; // Init value.
  }

  while (1) {
    recoversubfaces(misshlist, 0);

    if (misshlist->objects > 0) {
      if (b->fliplinklevel >= 0) {
        break;
      } else {
        if (misshlist->objects >= ms) {
          nit++;
          if (nit >= 3) {
            //break;
            // Do the last round with unbounded flip link level.
            b->fliplinklevel = 100000;
          }
        } else {
          ms = misshlist->objects;
          if (nit > 0) {
            nit--;
          }
        }
        for (i = 0; i < misshlist->objects; i++) {
          subfacstack->newindex((void **) &parysh);
          *parysh = * (face *) fastlookup(misshlist, i);
        }
        misshlist->restart();
        autofliplinklevel+=b->fliplinklevelinc;
      }
    } else {
      // All subfaces are recovered.
      break;
    }
  } // while (1)

  if (b->verbose) {
    printf("  %ld (%ld) subfaces are recovered (missing).\n", 
           subfaces->items - misshlist->objects, misshlist->objects);
  }

  if (misshlist->objects > 0) {
    // There are missing subfaces. Add Steiner points.
    for (i = 0; i < misshlist->objects; i++) {
      subfacstack->newindex((void **) &parysh);
      *parysh = * (face *) fastlookup(misshlist, i);
    }
    misshlist->restart();

    recoversubfaces(NULL, 1);

    if (b->verbose) {
      printf("  Added %ld Steiner points in facets.\n", st_facref_count);
    }
  }


  if (st_facref_count > 0) {
    // Try to remove the Steiner points added in facets.
    bak_facref_count = st_facref_count;
    for (i = 0; i < subvertstack->objects; i++) {
      // Get the Steiner point.
      parypt = (point *) fastlookup(subvertstack, i);
      rempt = *parypt;
      if (!removevertexbyflips(*parypt)) {
        // Save it in list.
        bdrysteinerptlist->newindex((void **) &parypt);
        *parypt = rempt;
      }
    }
    if (b->verbose) {
      if (st_facref_count < bak_facref_count) {
        printf("  Removed %ld Steiner points in facets.\n", 
               bak_facref_count - st_facref_count);
      }
    }
    subvertstack->restart();
  }


  if (bdrysteinerptlist->objects > 0) {
    if (b->verbose) {
      printf("  %ld Steiner points remained in boundary.\n",
             bdrysteinerptlist->objects);
    }
  } // if


  // Accumulate the dynamic memory.
  totalworkmemory += (misseglist->totalmemory + misshlist->totalmemory +
                      bdrysteinerptlist->totalmemory);

  delete bdrysteinerptlist;
  delete misseglist;
  delete misshlist;
}